

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O3

Utest * __thiscall
TEST_DoublingFactorCounterTest_Not_TerminalInEachSet_NotTerminalPair_TestShell::createTest
          (TEST_DoublingFactorCounterTest_Not_TerminalInEachSet_NotTerminalPair_TestShell *this)

{
  TEST_DoublingFactorCounterTest_Not_TerminalInEachSet_NotTerminalPair_Test *this_00;
  
  this_00 = (TEST_DoublingFactorCounterTest_Not_TerminalInEachSet_NotTerminalPair_Test *)
            operator_new(0xc0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                         ,0x251);
  TEST_DoublingFactorCounterTest_Not_TerminalInEachSet_NotTerminalPair_Test::
  TEST_DoublingFactorCounterTest_Not_TerminalInEachSet_NotTerminalPair_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(DoublingFactorCounterTest, Not_TerminalInEachSet_NotTerminalPair)
{
	addPair(Tile::WestWind);
	addSequence(Tile::OneOfCharacters, false);
	addTriplet(Tile::NineOfCircles, false);
	addSequence(Tile::OneOfBamboos, false);
	addSequence(Tile::SevenOfBamboos, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(0, r.patterns.count(Pattern::TerminalInEachSet));
}